

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  string local_3e0 [32];
  int local_3c0;
  int i;
  stringstream local_3b0 [8];
  stringstream ss;
  ostream local_3a0 [376];
  undefined1 local_228 [8];
  fstream in;
  char **argv_local;
  int argc_local;
  
  core_initialization();
  std::fstream::fstream(local_228);
  std::__cxx11::stringstream::stringstream(local_3b0);
  for (local_3c0 = 1; local_3c0 < argc; local_3c0 = local_3c0 + 1) {
    poVar1 = std::operator<<(local_3a0,argv[local_3c0]);
    std::operator<<(poVar1," ");
  }
  core_query((stringstream *)local_3b0);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,local_3e0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::stringstream::~stringstream(local_3b0);
  std::fstream::~fstream(local_228);
  return 0;
}

Assistant:

int main(int argc,char *argv[])
{
    core_initialization();
    fstream in;
    stringstream ss;

    #ifdef DEBUG
        string str;
        in.open("query.txt",ios::in);
        while(in.good()){
            in>>str;
            ss<<str<<" ";
        }
    #else
        for(int i=1;i<argc;i++)
            ss<<argv[i]<<" ";
    #endif

    cout<<core_query(ss).str();

    #ifdef WINDOWS
        system("pause");
    #endif
    return 0;
}